

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_NodeStoreEntry * instantiateEntry(UA_NodeClass nodeClass)

{
  UA_NodeStoreEntry *pUVar1;
  size_t __size;
  
  pUVar1 = (UA_NodeStoreEntry *)0x0;
  if ((int)nodeClass < 0x10) {
    switch(nodeClass) {
    case UA_NODECLASS_OBJECT:
      __size = 0xa8;
      break;
    case UA_NODECLASS_VARIABLE:
      __size = 0x160;
      break;
    default:
      goto switchD_0011d19a_caseD_3;
    case UA_NODECLASS_METHOD:
    case UA_NODECLASS_OBJECTTYPE:
      __size = 0xb0;
    }
  }
  else if ((int)nodeClass < 0x40) {
    if (nodeClass == UA_NODECLASS_VARIABLETYPE) {
      __size = 0x150;
    }
    else {
      if (nodeClass != UA_NODECLASS_REFERENCETYPE) {
        return (UA_NodeStoreEntry *)0x0;
      }
      __size = 0xc0;
    }
  }
  else {
    if ((nodeClass != UA_NODECLASS_DATATYPE) && (nodeClass != UA_NODECLASS_VIEW)) {
      return (UA_NodeStoreEntry *)0x0;
    }
    __size = 0xa0;
  }
  pUVar1 = (UA_NodeStoreEntry *)calloc(1,__size);
  if (pUVar1 == (UA_NodeStoreEntry *)0x0) {
    pUVar1 = (UA_NodeStoreEntry *)0x0;
  }
  else {
    (pUVar1->node).nodeClass = nodeClass;
  }
switchD_0011d19a_caseD_3:
  return pUVar1;
}

Assistant:

static UA_NodeStoreEntry *
instantiateEntry(UA_NodeClass nodeClass) {
    size_t size = sizeof(UA_NodeStoreEntry) - sizeof(UA_Node);
    switch(nodeClass) {
    case UA_NODECLASS_OBJECT:
        size += sizeof(UA_ObjectNode);
        break;
    case UA_NODECLASS_VARIABLE:
        size += sizeof(UA_VariableNode);
        break;
    case UA_NODECLASS_METHOD:
        size += sizeof(UA_MethodNode);
        break;
    case UA_NODECLASS_OBJECTTYPE:
        size += sizeof(UA_ObjectTypeNode);
        break;
    case UA_NODECLASS_VARIABLETYPE:
        size += sizeof(UA_VariableTypeNode);
        break;
    case UA_NODECLASS_REFERENCETYPE:
        size += sizeof(UA_ReferenceTypeNode);
        break;
    case UA_NODECLASS_DATATYPE:
        size += sizeof(UA_DataTypeNode);
        break;
    case UA_NODECLASS_VIEW:
        size += sizeof(UA_ViewNode);
        break;
    default:
        return NULL;
    }
    UA_NodeStoreEntry *entry = UA_calloc(1, size);
    if(!entry)
        return NULL;
    entry->node.nodeClass = nodeClass;
    return entry;
}